

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::FromDMReader::Initialize(FromDMReader *this,DMatrix **dmatrix)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long in_RDI;
  int i;
  bool in_stack_000000b7;
  size_t in_stack_000000b8;
  DMatrix *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  value_type vVar4;
  value_type vVar5;
  
  *(pointer *)(in_RDI + 0xd8) =
       (in_RSI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  *(byte *)(in_RDI + 0x98) = *(byte *)(*(long *)(in_RDI + 0xd8) + 0x60) & 1;
  *(undefined4 *)(in_RDI + 0xe0) = *(undefined4 *)(*(long *)(in_RDI + 0xd8) + 0x10);
  DMatrix::ReAlloc(in_stack_000000c0,in_stack_000000b8,in_stack_000000b7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  vVar4 = 0;
  while( true ) {
    uVar1 = (ulong)(int)vVar4;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xe8));
    if (sVar2 <= uVar1) break;
    vVar5 = vVar4;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xe8),
                        (long)(int)vVar4);
    *pvVar3 = vVar4;
    vVar4 = vVar5 + 1;
  }
  return;
}

Assistant:

void FromDMReader::Initialize(xLearn::DMatrix* &dmatrix) { 
  this->data_ptr_ = dmatrix;
  has_label_ = this->data_ptr_->has_label;
  num_samples_ = this->data_ptr_->row_length;
  data_samples_.ReAlloc(num_samples_, has_label_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
}